

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteIntroduction
          (ReflectionClassGenerator *this,Printer *printer)

{
  Printer *this_00;
  string *psVar1;
  ulong uVar2;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ReflectionClassGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  psVar1 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $file_name$\n#pragma warning disable 1591, 0612, 3021\n#region Designer generated code\n\nusing pb = global::Google.Protobuf;\nusing pbc = global::Google.Protobuf.Collections;\nusing pbr = global::Google.Protobuf.Reflection;\nusing scg = global::System.Collections.Generic;\n"
                     ,"file_name",psVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    io::Printer::Print(local_18,"namespace $namespace$ {\n","namespace",&this->namespace_);
    io::Printer::Indent(local_18);
    io::Printer::Print(local_18,"\n");
  }
  this_00 = local_18;
  psVar1 = FileDescriptor::name_abi_cxx11_(this->file_);
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_38,&this->super_SourceGeneratorBase);
  io::Printer::Print(this_00,
                     "/// <summary>Holder for reflection information generated from $file_name$</summary>\n$access_level$ static partial class $reflection_class_name$ {\n\n"
                     ,"file_name",psVar1,"access_level",&local_38,"reflection_class_name",
                     &this->reflectionClassname_);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(local_18);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteIntroduction(io::Printer* printer) {
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $file_name$\n"
    "#pragma warning disable 1591, 0612, 3021\n"
    "#region Designer generated code\n"
    "\n"
    "using pb = global::Google.Protobuf;\n"
    "using pbc = global::Google.Protobuf.Collections;\n"
    "using pbr = global::Google.Protobuf.Reflection;\n"
    "using scg = global::System.Collections.Generic;\n",
    "file_name", file_->name());

  if (!namespace_.empty()) {
    printer->Print("namespace $namespace$ {\n", "namespace", namespace_);
    printer->Indent();
    printer->Print("\n");
  }

  printer->Print(
    "/// <summary>Holder for reflection information generated from $file_name$</summary>\n"
    "$access_level$ static partial class $reflection_class_name$ {\n"
    "\n",
    "file_name", file_->name(),
    "access_level", class_access_level(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
}